

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdout_sinks-inl.h
# Opt level: O3

shared_ptr<spdlog::logger> __thiscall
spdlog::stdout_logger_mt<spdlog::synchronous_factory>(spdlog *this,string *logger_name)

{
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<spdlog::logger> sVar3;
  string local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  
  pcVar1 = (logger_name->_M_dataplus)._M_p;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + logger_name->_M_string_length);
  sVar3 = synchronous_factory::create<spdlog::sinks::stdout_sink<spdlog::details::console_mutex>>
                    ((synchronous_factory *)this,&local_38);
  _Var2 = sVar3.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
    _Var2._M_pi = extraout_RDX;
  }
  sVar3.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  sVar3.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<spdlog::logger>)
         sVar3.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SPDLOG_INLINE std::shared_ptr<logger> stdout_logger_mt(const std::string &logger_name) {
    return Factory::template create<sinks::stdout_sink_mt>(logger_name);
}